

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O2

HighsStatus __thiscall Highs::getIisInterface(Highs *this)

{
  HighsIis *this_00;
  HighsModel *lp;
  uint uVar1;
  pointer pHVar2;
  bool bVar3;
  HighsStatus HVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  vector<int,_std::allocator<int>_> infeasible_row_subset;
  HighsLp check_lp_before;
  HighsLp check_lp_after;
  
  HVar4 = kOk;
  if ((this->iis_).valid_ == false) {
    this_00 = &this->iis_;
    HighsIis::invalidate(this_00);
    lp = &this->model_;
    bVar3 = HighsIis::trivial(this_00,&lp->lp_,&this->options_);
    HVar4 = kOk;
    if (!bVar3) {
      if ((this->model_).lp_.num_row_ == 0) {
        this_00->valid_ = true;
      }
      else {
        infeasible_row_subset.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        infeasible_row_subset.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        infeasible_row_subset.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        invalidateSolverData(this);
        HighsLp::HighsLp(&check_lp_before,&lp->lp_);
        HVar4 = elasticityFilter(this,-1.0,-1.0,1.0,(double *)0x0,(double *)0x0,(double *)0x0,true,
                                 &infeasible_row_subset);
        HighsLp::HighsLp(&check_lp_after,&lp->lp_);
        HighsLp::~HighsLp(&check_lp_after);
        HighsLp::~HighsLp(&check_lp_before);
        if (HVar4 == kOk) {
          if (infeasible_row_subset.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              infeasible_row_subset.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            this_00->valid_ = true;
            HVar4 = kOk;
          }
          else {
            HVar4 = HighsIis::getData(this_00,&lp->lp_,&this->options_,&this->basis_,
                                      &infeasible_row_subset);
            if ((HVar4 == kOk) &&
               (((this->iis_).col_index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish !=
                 (this->iis_).col_index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start ||
                ((this->iis_).row_index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish !=
                 (this->iis_).row_index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start)))) {
              this->model_status_ = kInfeasible;
            }
            pHVar2 = (this->iis_).info_.
                     super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar9 = (ulong)((long)(this->iis_).info_.
                                  super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)pHVar2) >> 4;
            lVar5 = 0;
            iVar8 = (int)uVar9;
            uVar7 = 0;
            if (0 < iVar8) {
              uVar7 = uVar9 & 0xffffffff;
            }
            dVar13 = INFINITY;
            dVar14 = 0.0;
            uVar10 = 0x7fffffff;
            uVar11 = 0;
            dVar15 = 0.0;
            iVar6 = 0;
            for (; uVar7 * 0x10 != lVar5; lVar5 = lVar5 + 0x10) {
              dVar12 = *(double *)((long)&pHVar2->simplex_time + lVar5);
              uVar1 = *(uint *)((long)&pHVar2->simplex_iterations + lVar5);
              if (dVar12 <= dVar13) {
                dVar13 = dVar12;
              }
              dVar15 = dVar15 + dVar12;
              if (dVar14 <= dVar12) {
                dVar14 = dVar12;
              }
              if ((int)uVar1 <= (int)uVar10) {
                uVar10 = (ulong)uVar1;
              }
              iVar6 = iVar6 + uVar1;
              if ((int)uVar11 < (int)uVar1) {
                uVar11 = (ulong)uVar1;
              }
            }
            dVar14 = 0.0;
            if (iVar8 < 1) {
              dVar12 = 0.0;
            }
            else {
              dVar12 = (double)iVar6 / (double)iVar8;
              dVar14 = dVar15 / (double)iVar8;
            }
            highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                         " %d cols, %d rows, %d LPs solved (min / average / max) iteration count (%6d / %6.2g / % 6d) and time (%6.2f / %6.2f / % 6.2f) \n"
                         ,dVar12,dVar13,dVar14,
                         (ulong)((long)(this->iis_).col_index_.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)(this->iis_).col_index_.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 2,
                         (ulong)((long)(this->iis_).row_index_.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)(this->iis_).row_index_.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 2,uVar9,uVar10,uVar11);
          }
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&infeasible_row_subset.super__Vector_base<int,_std::allocator<int>_>);
      }
    }
  }
  return HVar4;
}

Assistant:

HighsStatus Highs::getIisInterface() {
  if (this->iis_.valid_) return HighsStatus::kOk;
  this->iis_.invalidate();
  HighsLp& lp = model_.lp_;
  // Check for trivial IIS: empty infeasible row or inconsistent bounds
  if (this->iis_.trivial(lp, options_)) return HighsStatus::kOk;
  HighsInt num_row = lp.num_row_;
  if (num_row == 0) {
    // For an LP with no rows, the only scope for infeasibility is
    // inconsistent columns bounds - which has already been assessed,
    // so validate the empty HighsIis instance
    this->iis_.valid_ = true;
    return HighsStatus::kOk;
  }
  const bool ray_option = false;
  //      options_.iis_strategy == kIisStrategyFromRayRowPriority ||
  //      options_.iis_strategy == kIisStrategyFromRayColPriority;
  if (this->model_status_ == HighsModelStatus::kInfeasible && ray_option &&
      !ekk_instance_.status_.has_invert) {
    // Model is known to be infeasible, and a dual ray option is
    // chosen, but it has no INVERT, presumably because infeasibility
    // detected in presolve, so solve without presolve
    std::string presolve = options_.presolve;
    options_.presolve = kHighsOffString;

    HighsIisInfo iis_info;
    iis_info.simplex_time = -this->getRunTime();
    iis_info.simplex_iterations = -info_.simplex_iteration_count;
    HighsStatus run_status = this->run();
    options_.presolve = presolve;
    if (run_status != HighsStatus::kOk) return run_status;
    iis_info.simplex_time += this->getRunTime();
    iis_info.simplex_iterations += -info_.simplex_iteration_count;
    this->iis_.info_.push_back(iis_info);

    // Model should remain infeasible!
    if (this->model_status_ != HighsModelStatus::kInfeasible) {
      highsLogUser(
          options_.log_options, HighsLogType::kError,
          "Model status has switched from %s to %s when solving without "
          "presolve\n",
          this->modelStatusToString(HighsModelStatus::kInfeasible).c_str(),
          this->modelStatusToString(this->model_status_).c_str());
      return HighsStatus::kError;
    }
  }
  const bool has_dual_ray = ekk_instance_.dual_ray_record_.index != kNoRayIndex;
  if (ray_option && !has_dual_ray)
    highsLogUser(
        options_.log_options, HighsLogType::kWarning,
        "No known dual ray from which to compute IIS: using whole model\n");
  std::vector<HighsInt> infeasible_row_subset;
  if (ray_option && has_dual_ray) {
    // Compute the dual ray to identify an infeasible subset of rows
    assert(ekk_instance_.status_.has_invert);
    assert(!lp.is_moved_);
    std::vector<double> rhs;
    HighsInt iRow = ekk_instance_.dual_ray_record_.index;
    rhs.assign(num_row, 0);
    rhs[iRow] = 1;
    std::vector<double> dual_ray_value(num_row);
    HighsInt* dual_ray_num_nz = 0;
    basisSolveInterface(rhs, dual_ray_value.data(), dual_ray_num_nz, NULL,
                        true);
    for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++)
      if (dual_ray_value[iRow]) infeasible_row_subset.push_back(iRow);
  } else {
    // Full LP option chosen or no dual ray to use
    //
    // Working on the whole model so clear all solver data
    this->invalidateSolverData();
    // 1789 Remove this check!
    HighsLp check_lp_before = this->model_.lp_;
    // Apply the elasticity filter to the whole model in order to
    // determine an infeasible subset of rows
    HighsStatus return_status =
        this->elasticityFilter(-1.0, -1.0, 1.0, nullptr, nullptr, nullptr, true,
                               infeasible_row_subset);
    HighsLp check_lp_after = this->model_.lp_;
    assert(check_lp_before.equalButForScalingAndNames(check_lp_after));
    if (return_status != HighsStatus::kOk) return return_status;
  }
  HighsStatus return_status = HighsStatus::kOk;
  if (infeasible_row_subset.size() == 0) {
    // No subset of infeasible rows, so model is feasible
    this->iis_.valid_ = true;
  } else {
    return_status =
        this->iis_.getData(lp, options_, basis_, infeasible_row_subset);
    if (return_status == HighsStatus::kOk) {
      // Existence of non-empty IIS => infeasibility
      if (this->iis_.col_index_.size() > 0 || this->iis_.row_index_.size() > 0)
        this->model_status_ = HighsModelStatus::kInfeasible;
    }
    // Analyse the LP solution data
    const HighsInt num_lp_solved = this->iis_.info_.size();
    double min_time = kHighsInf;
    double sum_time = 0;
    double max_time = 0;
    HighsInt min_iterations = kHighsIInf;
    HighsInt sum_iterations = 0;
    HighsInt max_iterations = 0;
    for (HighsInt iX = 0; iX < num_lp_solved; iX++) {
      double time = this->iis_.info_[iX].simplex_time;
      HighsInt iterations = this->iis_.info_[iX].simplex_iterations;
      min_time = std::min(time, min_time);
      sum_time += time;
      max_time = std::max(time, max_time);
      min_iterations = std::min(iterations, min_iterations);
      sum_iterations += iterations;
      max_iterations = std::max(iterations, max_iterations);
    }
    highsLogUser(options_.log_options, HighsLogType::kInfo,
                 " %d cols, %d rows, %d LPs solved"
                 " (min / average / max) iteration count (%6d / %6.2g / % 6d)"
                 " and time (%6.2f / %6.2f / % 6.2f) \n",
                 int(this->iis_.col_index_.size()),
                 int(this->iis_.row_index_.size()), int(num_lp_solved),
                 int(min_iterations),
                 num_lp_solved > 0 ? (1.0 * sum_iterations) / num_lp_solved : 0,
                 int(max_iterations), min_time,
                 num_lp_solved > 0 ? sum_time / num_lp_solved : 0, max_time);
  }
  return return_status;
}